

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

void cfgfile::string_trait_t::fill_buf
               (istream_t *stream,buf_t *buf,pos_t buf_size,pos_t *pos,pos_t size)

{
  pointer pcVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  pointer pcVar5;
  size_type __n;
  long lVar6;
  allocator_type local_42;
  value_type_conflict local_41;
  _Vector_base<char,_std::allocator<char>_> local_40;
  
  __n = size - *pos;
  if (buf_size <= size - *pos) {
    __n = buf_size;
  }
  local_41 = '\0';
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_40,__n,&local_41,&local_42);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(buf,&local_40);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_40);
  pcVar1 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pcVar5 = pcVar2;
  if (pcVar2 != pcVar1) {
    std::istream::read((char *)stream,(long)pcVar1);
    pcVar2 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pcVar5 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  lVar3 = (long)pcVar5 - (long)pcVar2;
  lVar6 = 0;
  for (; (lVar4 = lVar3, pcVar5 != pcVar2 && (lVar4 = lVar6, pcVar5[-1] == '\0'));
      pcVar5 = pcVar5 + -1) {
    lVar6 = lVar6 + 1;
  }
  if (lVar4 != 0) {
    std::vector<char,_std::allocator<char>_>::resize(buf,__n - lVar4);
  }
  *pos = *pos + __n;
  return;
}

Assistant:

static inline void fill_buf( istream_t & stream, buf_t & buf, pos_t buf_size, pos_t & pos, pos_t size )
	{
		pos_t actual_size = ( size - pos < buf_size ? size - pos : buf_size );

		buf = buf_t( actual_size, 0x00 );

		if( buf.size() > 0 )
			stream.read( &buf[ 0 ], actual_size );

		std::size_t skip = 0;

		for( auto it = buf.crbegin(), last = buf.crend(); it != last; ++it )
		{
			if( *it == 0x00 )
				++skip;
			else
				break;
		}

		if( skip > 0 )
			buf.resize( actual_size - skip );

		pos += actual_size;
	}